

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::WildcardPattern::WildcardPattern
          (WildcardPattern *this,string *pattern,Choice caseSensitivity)

{
  string *__return_storage_ptr__;
  size_type sVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  this->_vptr_WildcardPattern = (_func_int **)&PTR__WildcardPattern_001a6800;
  this->m_caseSensitivity = caseSensitivity;
  this->m_wildcard = NoWildcard;
  __return_storage_ptr__ = &this->m_pattern;
  normaliseString(__return_storage_ptr__,this,pattern);
  sVar1 = (this->m_pattern)._M_string_length;
  if (sVar1 != 0) {
    if (*(__return_storage_ptr__->_M_dataplus)._M_p == '*') {
      std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0]);
      }
      this->m_wildcard = WildcardAtStart;
      sVar1 = (this->m_pattern)._M_string_length;
      if (sVar1 == 0) {
        return;
      }
    }
    if ((__return_storage_ptr__->_M_dataplus)._M_p[sVar1 - 1] == '*') {
      std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0]);
      }
      *(undefined1 *)&this->m_wildcard = (char)this->m_wildcard | WildcardAtEnd;
    }
  }
  return;
}

Assistant:

WildcardPattern::WildcardPattern( std::string const& pattern,
                                      CaseSensitive::Choice caseSensitivity )
    :   m_caseSensitivity( caseSensitivity ),
        m_pattern( normaliseString( pattern ) )
    {
        if( startsWith( m_pattern, '*' ) ) {
            m_pattern = m_pattern.substr( 1 );
            m_wildcard = WildcardAtStart;
        }
        if( endsWith( m_pattern, '*' ) ) {
            m_pattern = m_pattern.substr( 0, m_pattern.size()-1 );
            m_wildcard = static_cast<WildcardPosition>( m_wildcard | WildcardAtEnd );
        }
    }